

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O3

size_t __thiscall
Js::StackTraceHelper::PrintStackTrace
          (StackTraceHelper *this,ULONG framesToSkip,ULONG framesToCapture)

{
  StackBackTrace *this_00;
  size_t sVar1;
  AutoNestedHandledExceptionType local_24 [2];
  AutoNestedHandledExceptionType autoNestedHandledExceptionType;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_24,ExceptionType_DisableCheck);
  this_00 = GetStackBackTrace(this,framesToCapture);
  StackBackTrace::Capture(this_00,framesToSkip);
  sVar1 = StackBackTrace::Print(this_00);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_24);
  return sVar1;
}

Assistant:

size_t StackTraceHelper::PrintStackTrace(ULONG framesToSkip, ULONG framesToCapture)
    {
#ifdef EXCEPTION_CHECK
        AutoNestedHandledExceptionType autoNestedHandledExceptionType(ExceptionType_DisableCheck);
#endif
        StackBackTrace* stackTrace = this->GetStackBackTrace(framesToCapture);
        stackTrace->Capture(framesToSkip);
        return stackTrace->Print();
    }